

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::CopyImportedCxxModulesProperties(cmTarget *this,cmTarget *tgt)

{
  bool bVar1;
  int iVar2;
  cmGlobalGenerator *pcVar3;
  pointer s;
  long lVar4;
  allocator<char> aStack_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  allocator<char> local_b8;
  allocator<char> local_b7;
  allocator<char> local_b6;
  allocator<char> local_b5;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  allocator<char> local_b0;
  allocator<char> local_af;
  allocator<char> local_ae;
  allocator<char> local_ad;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  cmTarget *local_a8;
  string *local_a0;
  anon_class_16_2_633baf8e copyProperty;
  string configUpper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  cmValue xcodeGenerateScheme;
  
  bVar1 = IsNormal(this);
  if (bVar1) {
    __assert_fail("!this->IsNormal()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                  ,0x70c,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
  }
  bVar1 = IsImported(this);
  if (!bVar1) {
    bVar1 = IsImported(tgt);
    if (bVar1) {
      local_a8 = this;
      if (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                                     propertiesToCopy_abi_cxx11_);
        if (iVar2 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_,
                     "DEFINE_SYMBOL",(allocator<char> *)&configUpper);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 1),"DEPRECATION",(allocator<char> *)&xcodeGenerateScheme);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 2),"NO_SYSTEM_FROM_IMPORTED",(allocator<char> *)&configNames);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 3),"POSITION_INDEPENDENT_CODE",(allocator<char> *)&copyProperty);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 4),"VISIBILITY_INLINES_HIDDEN",&aStack_c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 5),"ANDROID_API",&local_a9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 6),"ANDROID_API_MIN",&local_aa);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 7),"ANDROID_ARCH",&local_ab);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 8),"ANDROID_STL_TYPE",&local_ac);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 9),"OSX_ARCHITECTURES",&local_ad);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 10),"MSVC_DEBUG_INFORMATION_FORMAT",&local_ae);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xb),"MSVC_RUNTIME_LIBRARY",&local_af);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xc),"VS_PLATFORM_TOOLSET",&local_b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xd),"WATCOM_RUNTIME_LIBRARY",&local_b1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xe),"CXX_COMPILER_LAUNCHER",&local_b2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xf),"CXX_STANDARD",&local_b3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x10),"CXX_STANDARD_REQUIRED",&local_b4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x11),"CXX_EXTENSIONS",&local_b5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x12),"CXX_VISIBILITY_PRESET",&local_b6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x13),"CXX_CLANG_TIDY",&local_b7);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x14),"CXX_CLANG_TIDY_EXPORT_FIXES_DIR",&local_b8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x15),"CXX_CPPLINT",&local_b9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x16),"CXX_CPPCHECK",&local_ba);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x17),"CXX_INCLUDE_WHAT_YOU_USE",&local_bb);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x18),"EXCLUDE_FROM_ALL",&local_bc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x19),"EXCLUDE_FROM_DEFAULT_BUILD",&local_bd);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1a),"OPTIMIZE_DEPENDENCIES",&local_be);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1b),"JOB_POOL_COMPILE",&local_bf);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1c),"VS_NO_COMPILE_BATCHING",&local_c0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1d),"VS_PROJECT_IMPORT",&local_c1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1e),"EchoString",&local_c2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1f),"EXPORT_COMPILE_COMMANDS",&local_c3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x20),"FOLDER",&local_c4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x21),"LABELS",&local_c5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x22),"PROJECT_LABEL",&local_c6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x23),"SYSTEM",&local_c7);
          __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
          __cxa_guard_release(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                               propertiesToCopy_abi_cxx11_);
          this = local_a8;
        }
      }
      copyProperty.this = this;
      copyProperty.tgt = tgt;
      for (lVar4 = 0; lVar4 != 0x480; lVar4 = lVar4 + 0x20) {
        CopyImportedCxxModulesProperties::anon_class_16_2_633baf8e::operator()
                  (&copyProperty,
                   (string *)
                   ((long)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                           propertiesToCopy_abi_cxx11_[0]._M_dataplus._M_p + lVar4));
      }
      if (CopyImportedCxxModulesProperties(cmTarget_const*)::perConfigPropertiesToCopy == '\0') {
        iVar2 = __cxa_guard_acquire(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                                     perConfigPropertiesToCopy);
        if (iVar2 != 0) {
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[0].super_string_view._M_len =
               0x1b;
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[0].super_string_view._M_str =
               "EXCLUDE_FROM_DEFAULT_BUILD_";
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[1].super_string_view._M_len =
               0x15;
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[1].super_string_view._M_str =
               "IMPORTED_CXX_MODULES_";
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[2].super_string_view._M_len =
               0x14;
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[2].super_string_view._M_str =
               "MAP_IMPORTED_CONFIG_";
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[3].super_string_view._M_len =
               0x12;
          CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[3].super_string_view._M_str =
               "OSX_ARCHITECTURES_";
          __cxa_guard_release(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                               perConfigPropertiesToCopy);
        }
      }
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                (&configNames,
                 ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                 ExcludeEmptyConfig);
      local_a0 = configNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (s = configNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; s != local_a0; s = s + 1) {
        cmsys::SystemTools::UpperCase(&configUpper,s);
        for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
          cmStrCat<cm::static_string_view_const&,std::__cxx11::string&>
                    ((string *)&xcodeGenerateScheme,
                     (static_string_view *)
                     ((long)&CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[0].
                             super_string_view._M_len + lVar4),&configUpper);
          CopyImportedCxxModulesProperties::anon_class_16_2_633baf8e::operator()
                    (&copyProperty,(string *)&xcodeGenerateScheme);
          std::__cxx11::string::~string((string *)&xcodeGenerateScheme);
        }
        std::__cxx11::string::~string((string *)&configUpper);
        this = local_a8;
      }
      pcVar3 = GetGlobalGenerator(this);
      iVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x29])(pcVar3);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configUpper,"XCODE_GENERATE_SCHEME",&aStack_c8);
        xcodeGenerateScheme =
             CopyImportedCxxModulesProperties::anon_class_16_2_633baf8e::operator()
                       (&copyProperty,&configUpper);
        std::__cxx11::string::~string((string *)&configUpper);
        cmValue::IsOn(&xcodeGenerateScheme);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configNames);
      return;
    }
    __assert_fail("tgt->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                  ,0x710,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
  }
  __assert_fail("!this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                ,0x70e,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
}

Assistant:

void cmTarget::CopyImportedCxxModulesProperties(cmTarget const* tgt)
{
  // Normal targets cannot be the target of a copy.
  assert(!this->IsNormal());
  // Imported targets cannot be the target of a copy.
  assert(!this->IsImported());
  // Only imported targets can be the source of a copy.
  assert(tgt->IsImported());

  // The list of properties that are relevant here include:
  // - compilation-specific properties for any language or platform
  // - compilation-specific properties for C++
  // - build graph-specific properties that affect compilation
  // - IDE metadata properties
  // - static analysis properties

  static const std::string propertiesToCopy[] = {
    // Compilation properties
    "DEFINE_SYMBOL",
    "DEPRECATION",
    "NO_SYSTEM_FROM_IMPORTED",
    "POSITION_INDEPENDENT_CODE",
    "VISIBILITY_INLINES_HIDDEN",
    // -- Platforms
    // ---- Android
    "ANDROID_API",
    "ANDROID_API_MIN",
    "ANDROID_ARCH",
    "ANDROID_STL_TYPE",
    // ---- macOS
    "OSX_ARCHITECTURES",
    // ---- Windows
    "MSVC_DEBUG_INFORMATION_FORMAT",
    "MSVC_RUNTIME_LIBRARY",
    "VS_PLATFORM_TOOLSET",
    // ---- OpenWatcom
    "WATCOM_RUNTIME_LIBRARY",
    // -- Language
    // ---- C++
    "CXX_COMPILER_LAUNCHER",
    "CXX_STANDARD",
    "CXX_STANDARD_REQUIRED",
    "CXX_EXTENSIONS",
    "CXX_VISIBILITY_PRESET",

    // Static analysis
    "CXX_CLANG_TIDY",
    "CXX_CLANG_TIDY_EXPORT_FIXES_DIR",
    "CXX_CPPLINT",
    "CXX_CPPCHECK",
    "CXX_INCLUDE_WHAT_YOU_USE",

    // Build graph properties
    "EXCLUDE_FROM_ALL",
    "EXCLUDE_FROM_DEFAULT_BUILD",
    "OPTIMIZE_DEPENDENCIES",
    // -- Ninja
    "JOB_POOL_COMPILE",
    // -- Visual Studio
    "VS_NO_COMPILE_BATCHING",
    "VS_PROJECT_IMPORT",

    // Metadata
    "EchoString",
    "EXPORT_COMPILE_COMMANDS",
    "FOLDER",
    "LABELS",
    "PROJECT_LABEL",
    "SYSTEM",
  };

  auto copyProperty = [this, tgt](std::string const& prop) -> cmValue {
    cmValue value = tgt->GetProperty(prop);
    // Always set the property; it may have been explicitly unset.
    this->SetProperty(prop, value);
    return value;
  };

  for (auto const& prop : propertiesToCopy) {
    copyProperty(prop);
  }

  static const cm::static_string_view perConfigPropertiesToCopy[] = {
    "EXCLUDE_FROM_DEFAULT_BUILD_"_s,
    "IMPORTED_CXX_MODULES_"_s,
    "MAP_IMPORTED_CONFIG_"_s,
    "OSX_ARCHITECTURES_"_s,
  };

  std::vector<std::string> configNames =
    this->impl->Makefile->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
  for (std::string const& configName : configNames) {
    std::string configUpper = cmSystemTools::UpperCase(configName);
    for (auto const& perConfigProp : perConfigPropertiesToCopy) {
      copyProperty(cmStrCat(perConfigProp, configUpper));
    }
  }

  if (this->GetGlobalGenerator()->IsXcode()) {
    cmValue xcodeGenerateScheme = copyProperty("XCODE_GENERATE_SCHEME");

    // TODO: Make sure these show up on the imported target in the first place
    // XCODE_ATTRIBUTE_???

    if (xcodeGenerateScheme.IsOn()) {
#ifdef __APPLE__
      static const std::string xcodeSchemePropertiesToCopy[] = {
        // FIXME: Do all of these apply? Do they matter?
        "XCODE_SCHEME_ADDRESS_SANITIZER",
        "XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN",
        "XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER",
        "XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS",
        "XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE",
        "XCODE_SCHEME_ENABLE_GPU_API_VALIDATION",
        "XCODE_SCHEME_ENABLE_GPU_SHADER_VALIDATION",
        "XCODE_SCHEME_GUARD_MALLOC",
        "XCODE_SCHEME_LAUNCH_CONFIGURATION",
        "XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP",
        "XCODE_SCHEME_MALLOC_GUARD_EDGES",
        "XCODE_SCHEME_MALLOC_SCRIBBLE",
        "XCODE_SCHEME_MALLOC_STACK",
        "XCODE_SCHEME_THREAD_SANITIZER",
        "XCODE_SCHEME_THREAD_SANITIZER_STOP",
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER",
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP",
        "XCODE_SCHEME_ZOMBIE_OBJECTS",
      };

      for (auto const& xcodeProperty : xcodeSchemePropertiesToCopy) {
        copyProperty(xcodeProperty);
      }
#endif
    }
  }
}